

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureDivision.hpp
# Opt level: O1

bool __thiscall njoy::ENDFtk::StructureDivision::isSendPermissive(StructureDivision *this)

{
  _Head_base<0UL,_double,_false> *p_Var1;
  bool bVar2;
  
  if (isSendPermissive()::empty == '\0') {
    isSendPermissive();
  }
  p_Var1 = &(this->base).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Head_base<0UL,_double,_false>;
  if (((isSendPermissive::empty.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Head_base<0UL,_double,_false>._M_head_impl == p_Var1->_M_head_impl) &&
      (!NAN(isSendPermissive::empty.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Head_base<0UL,_double,_false>._M_head_impl) && !NAN(p_Var1->_M_head_impl))) &&
     (bVar2 = record::
              Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
              ::equality<5>(&this->base,&isSendPermissive::empty), bVar2)) {
    return (this->tail).fields._M_elems[2] == 0;
  }
  return false;
}

Assistant:

bool isSendPermissive() const {

      const static Base empty(0.0, 0.0, 0, 0, 0, 0);
      return ( this->base == empty ) and ( this->tail.section() == 0 );
    }